

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnTryTableExpr
          (BinaryReaderIR *this,Type sig_type,CatchClauseVector *catches)

{
  Index IVar1;
  pointer pCVar2;
  char *pcVar3;
  Offset OVar4;
  BinaryReaderIR *pBVar5;
  Result RVar6;
  Result RVar7;
  Expr *pEVar8;
  CatchClause *raw_catch;
  pointer pCVar9;
  Location loc;
  Location local_178;
  BinaryReaderIR *local_158;
  Expr *local_150;
  pointer local_148;
  _Head_base<0UL,_wabt::Expr_*,_false> local_140;
  TableCatch local_138;
  Var local_78;
  
  pEVar8 = (Expr *)operator_new(0x130);
  (pEVar8->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (pEVar8->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  (pEVar8->loc).filename._M_len = 0;
  (pEVar8->loc).filename._M_str = (char *)0x0;
  *(undefined8 *)((long)&(pEVar8->loc).filename._M_str + 4) = 0;
  *(undefined8 *)((long)&(pEVar8->loc).field_1.field_1.offset + 4) = 0;
  pEVar8->type_ = TryTable;
  pEVar8->_vptr_Expr = (_func_int **)&PTR__TryTableExpr_001a5920;
  pEVar8[1]._vptr_Expr = (_func_int **)&pEVar8[1].super_intrusive_list_base<wabt::Expr>.prev_;
  pEVar8[1].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
  *(undefined1 *)&pEVar8[1].super_intrusive_list_base<wabt::Expr>.prev_ = 0;
  *(undefined1 *)&pEVar8[1].loc.filename._M_str = 0;
  Var::Var((Var *)&pEVar8[1].loc.field_1.field_0);
  pEVar8[4]._vptr_Expr = (_func_int **)0x0;
  pEVar8[4].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
  *(undefined8 *)((long)&pEVar8[3].loc.field_1 + 8) = 0;
  *(undefined8 *)&pEVar8[3].type_ = 0;
  pEVar8[3].loc.filename._M_str = (char *)0x0;
  pEVar8[3].loc.field_1.field_1.offset = 0;
  pEVar8[3].super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)0x0;
  pEVar8[3].loc.filename._M_len = 0;
  pEVar8[3]._vptr_Expr = (_func_int **)0x0;
  pEVar8[3].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
  *(undefined8 *)((long)&pEVar8[2].loc.field_1 + 8) = 0;
  *(undefined8 *)&pEVar8[2].type_ = 0;
  *(undefined4 *)&pEVar8[4].super_intrusive_list_base<wabt::Expr>.prev_ = 0;
  pEVar8[4].loc.filename._M_len = 0;
  pEVar8[4].loc.filename._M_str = (char *)0x0;
  pEVar8[4].loc.field_1.field_1.offset = 0;
  local_150 = pEVar8;
  std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::reserve
            ((vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_> *)&pEVar8[4].loc,
             ((long)(catches->
                    super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(catches->
                    super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555);
  local_158 = this;
  SetBlockDeclaration(this,(BlockDeclaration *)&pEVar8[1].loc.filename._M_str,sig_type);
  pBVar5 = local_158;
  pCVar9 = (catches->super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (catches->super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pCVar9 != pCVar2) {
    do {
      local_148 = pCVar2;
      local_138.loc.field_1.field_0.line = 0;
      local_138.loc.field_1._4_8_ = 0;
      local_138.loc.filename._M_len = 0;
      local_138.loc.filename._M_str._0_4_ = 0;
      local_138.loc.filename._M_str._4_4_ = 0;
      Var::Var(&local_138.tag);
      Var::Var(&local_138.target);
      local_138.kind = pCVar9->kind;
      IVar1 = pCVar9->tag;
      local_178.field_1.field_0.line = 0;
      local_178.field_1.field_0.first_column = 0;
      local_178.field_1.field_0.last_column = 0;
      local_178.filename._M_len = 0;
      local_178.filename._M_str._0_4_ = 0;
      local_178.filename._M_str._4_4_ = 0;
      pcVar3 = pBVar5->filename_;
      local_178.filename._M_len = strlen(pcVar3);
      local_178.filename._M_str._0_4_ = SUB84(pcVar3,0);
      local_178.filename._M_str._4_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
      OVar4 = ((pBVar5->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
      local_178.field_1.field_0.line = (int)OVar4;
      local_178.field_1.field_0.first_column = (int)(OVar4 >> 0x20);
      Var::Var(&local_78,IVar1,&local_178);
      Var::operator=(&local_138.tag,&local_78);
      Var::~Var(&local_78);
      IVar1 = pCVar9->depth;
      local_178.field_1.field_0.line = 0;
      local_178.field_1.field_0.first_column = 0;
      local_178.field_1.field_0.last_column = 0;
      local_178.filename._M_len = 0;
      local_178.filename._M_str._0_4_ = 0;
      local_178.filename._M_str._4_4_ = 0;
      pcVar3 = pBVar5->filename_;
      local_178.filename._M_len = strlen(pcVar3);
      local_178.filename._M_str._0_4_ = SUB84(pcVar3,0);
      local_178.filename._M_str._4_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
      OVar4 = ((pBVar5->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
      local_178.field_1.field_0.line = (int)OVar4;
      local_178.field_1.field_0.first_column = (int)(OVar4 >> 0x20);
      Var::Var(&local_78,IVar1,&local_178);
      Var::operator=(&local_138.target,&local_78);
      Var::~Var(&local_78);
      std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::
      emplace_back<wabt::TableCatch>
                ((vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_> *)&pEVar8[4].loc,
                 &local_138);
      Var::~Var(&local_138.target);
      Var::~Var(&local_138.tag);
      pCVar9 = pCVar9 + 1;
      pCVar2 = local_148;
    } while (pCVar9 != local_148);
  }
  pEVar8 = local_150;
  pBVar5 = local_158;
  local_140._M_head_impl = local_150;
  RVar6 = AppendExpr(local_158,
                     (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_140);
  if (local_140._M_head_impl != (Expr *)0x0) {
    (*(local_140._M_head_impl)->_vptr_Expr[1])();
  }
  local_140._M_head_impl = (Expr *)0x0;
  RVar7.enum_ = Error;
  if (RVar6.enum_ != Error) {
    (pBVar5->module_->features_used).exceptions = true;
    RVar7 = PushLabel(pBVar5,TryTable,(ExprList *)&pEVar8[3].loc.filename._M_str,pEVar8);
  }
  return (Result)RVar7.enum_;
}

Assistant:

Result BinaryReaderIR::OnTryTableExpr(Type sig_type,
                                      const CatchClauseVector& catches) {
  auto expr_ptr = std::make_unique<TryTableExpr>();
  TryTableExpr* expr = expr_ptr.get();
  expr->catches.reserve(catches.size());
  SetBlockDeclaration(&expr->block.decl, sig_type);
  ExprList* expr_list = &expr->block.exprs;

  for (auto& raw_catch : catches) {
    TableCatch catch_;
    catch_.kind = raw_catch.kind;
    catch_.tag = Var(raw_catch.tag, GetLocation());
    catch_.target = Var(raw_catch.depth, GetLocation());
    expr->catches.push_back(std::move(catch_));
  }

  CHECK_RESULT(AppendExpr(std::move(expr_ptr)));
  module_->features_used.exceptions = true;
  return PushLabel(LabelType::TryTable, expr_list, expr);
}